

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

float * __thiscall
google::protobuf::RepeatedField<float>::elements(RepeatedField<float> *this,bool is_soo)

{
  int iVar1;
  float *pfVar2;
  string *psVar3;
  void *ptr;
  RepeatedField<float> *this_00;
  long lVar4;
  int iVar5;
  undefined7 in_register_00000031;
  SooRep *this_01;
  Arena *this_02;
  Arena *pAStack_68;
  long lStack_60;
  SooRep *pSStack_58;
  Arena aAStack_50 [16];
  RepeatedField<float> *pRStack_40;
  SooRep local_20;
  
  iVar5 = 2;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar5 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar5 < 1) {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar5,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    if (is_soo) {
      return (float *)((long)&(this->soo_rep_).field_0 + 8);
    }
    pfVar2 = (float *)internal::LongSooRep::elements((LongSooRep *)this);
    return pfVar2;
  }
  this_01 = &local_20;
  elements();
  this_02 = aAStack_50;
  iVar5 = (int)psVar3;
  lVar4 = (long)iVar5;
  pRStack_40 = this;
  if (iVar5 < 0) {
    pSStack_58 = (SooRep *)0x1469ec;
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar4,0,"index >= 0");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    pSStack_58 = (SooRep *)0x1469b1;
    iVar1 = internal::SooRep::size
                      (this_01,(undefined1  [16])
                               ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    if (iVar5 < iVar1) {
      psVar3 = (string *)0x0;
    }
    else {
      pSStack_58 = (SooRep *)0x146a00;
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar4,(long)iVar1,"index < size()");
    }
    if (psVar3 == (string *)0x0) {
      pSStack_58 = (SooRep *)0x1469ce;
      pfVar2 = elements((RepeatedField<float> *)this_01,
                        (undefined1  [16])
                        ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
      return pfVar2 + lVar4;
    }
  }
  else {
    pSStack_58 = (SooRep *)0x146a0d;
    Mutable();
  }
  pSStack_58 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<float>>;
  Mutable();
  lStack_60 = lVar4;
  pSStack_58 = this_01;
  if (this_02 == (Arena *)0x0) {
    this_00 = (RepeatedField<float> *)operator_new(0x10);
    RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_02,0x10);
    pAStack_68 = this_02;
    this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
              Construct<google::protobuf::Arena*>(ptr,&pAStack_68);
  }
  return (float *)this_00;
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }